

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OneHotEncoder.pb.cc
# Opt level: O0

size_t __thiscall CoreML::Specification::OneHotEncoder::ByteSizeLong(OneHotEncoder *this)

{
  bool bVar1;
  OneHotEncoder_HandleUnknown OVar2;
  CategoryTypeCase CVar3;
  int iVar4;
  size_t sVar5;
  size_t sStack_18;
  int cached_size;
  size_t total_size;
  OneHotEncoder *this_local;
  
  sStack_18 = 0;
  bVar1 = outputsparse(this);
  if (bVar1) {
    sStack_18 = 2;
  }
  OVar2 = handleunknown(this);
  if (OVar2 != OneHotEncoder_HandleUnknown_ErrorOnUnknown) {
    OVar2 = handleunknown(this);
    sVar5 = google::protobuf::internal::WireFormatLite::EnumSize(OVar2);
    sStack_18 = sVar5 + 1 + sStack_18;
  }
  CVar3 = CategoryType_case(this);
  if (CVar3 != CATEGORYTYPE_NOT_SET) {
    if (CVar3 == kStringCategories) {
      sVar5 = google::protobuf::internal::WireFormatLite::
              MessageSizeNoVirtual<CoreML::Specification::StringVector>
                        ((this->CategoryType_).stringcategories_);
      sStack_18 = sVar5 + 1 + sStack_18;
    }
    else if (CVar3 == kInt64Categories) {
      sVar5 = google::protobuf::internal::WireFormatLite::
              MessageSizeNoVirtual<CoreML::Specification::Int64Vector>
                        ((this->CategoryType_).int64categories_);
      sStack_18 = sVar5 + 1 + sStack_18;
    }
  }
  iVar4 = google::protobuf::internal::ToCachedSize(sStack_18);
  this->_cached_size_ = iVar4;
  return sStack_18;
}

Assistant:

size_t OneHotEncoder::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.OneHotEncoder)
  size_t total_size = 0;

  // bool outputSparse = 10;
  if (this->outputsparse() != 0) {
    total_size += 1 + 1;
  }

  // .CoreML.Specification.OneHotEncoder.HandleUnknown handleUnknown = 11;
  if (this->handleunknown() != 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::EnumSize(this->handleunknown());
  }

  switch (CategoryType_case()) {
    // .CoreML.Specification.StringVector stringCategories = 1;
    case kStringCategories: {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *CategoryType_.stringcategories_);
      break;
    }
    // .CoreML.Specification.Int64Vector int64Categories = 2;
    case kInt64Categories: {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *CategoryType_.int64categories_);
      break;
    }
    case CATEGORYTYPE_NOT_SET: {
      break;
    }
  }
  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}